

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

long64 ClipperLib::TopX(IntPoint pt1,IntPoint pt2,long64 currentY)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double q;
  long64 currentY_local;
  IntPoint pt2_local;
  IntPoint pt1_local;
  
  lVar2 = pt1.Y;
  lVar3 = pt1.X;
  lVar1 = pt2.X;
  pt1_local.Y = lVar3;
  if (((currentY < lVar2) && (pt1_local.Y = lVar1, currentY != pt2.Y)) &&
     (pt1_local.Y = lVar3, lVar3 != lVar1)) {
    pt1_local.Y = Round((double)(currentY - lVar2) *
                        ((double)(lVar3 - lVar1) / (double)(lVar2 - pt2.Y)) + (double)lVar3);
  }
  return pt1_local.Y;
}

Assistant:

long64 TopX(const IntPoint pt1, const IntPoint pt2, const long64 currentY)
{
  //preconditions: pt1.Y <> pt2.Y and pt1.Y > pt2.Y
  if (currentY >= pt1.Y) return pt1.X;
  else if (currentY == pt2.Y) return pt2.X;
  else if (pt1.X == pt2.X) return pt1.X;
  else
  {
    double q = (double)(pt1.X-pt2.X)/(double)(pt1.Y-pt2.Y);
    return Round(pt1.X + (currentY - pt1.Y) *q);
  }
}